

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O0

int nni_taskq_init(nni_taskq **tqp,int nthr)

{
  int iVar1;
  nni_taskq *tq_00;
  nni_taskq_thr *pnVar2;
  int local_34;
  int i_1;
  int rv;
  int i;
  nni_taskq *tq;
  int nthr_local;
  nni_taskq **tqp_local;
  
  tq_00 = (nni_taskq *)nni_zalloc(0xc0);
  if (tq_00 == (nni_taskq *)0x0) {
    tqp_local._4_4_ = 2;
  }
  else {
    pnVar2 = (nni_taskq_thr *)nni_zalloc((long)nthr * 0xa0);
    tq_00->tq_threads = pnVar2;
    if (pnVar2 == (nni_taskq_thr *)0x0) {
      nni_free(tq_00,0xc0);
      tqp_local._4_4_ = 2;
    }
    else {
      tq_00->tq_nthreads = nthr;
      nni_list_init_offset((nni_list *)tq_00,0);
      nni_mtx_init(&tq_00->tq_mtx);
      nni_cv_init(&tq_00->tq_sched_cv,&tq_00->tq_mtx);
      nni_cv_init(&tq_00->tq_wait_cv,&tq_00->tq_mtx);
      for (i_1 = 0; i_1 < nthr; i_1 = i_1 + 1) {
        tq_00->tq_threads[i_1].tqt_tq = tq_00;
        iVar1 = nni_thr_init(&tq_00->tq_threads[i_1].tqt_thread,nni_taskq_thread,
                             tq_00->tq_threads + i_1);
        if (iVar1 != 0) {
          nni_taskq_fini(tq_00);
          return iVar1;
        }
      }
      tq_00->tq_run = true;
      for (local_34 = 0; local_34 < tq_00->tq_nthreads; local_34 = local_34 + 1) {
        nni_thr_run(&tq_00->tq_threads[local_34].tqt_thread);
      }
      *tqp = tq_00;
      tqp_local._4_4_ = 0;
    }
  }
  return tqp_local._4_4_;
}

Assistant:

int
nni_taskq_init(nni_taskq **tqp, int nthr)
{
	nni_taskq *tq;

	if ((tq = NNI_ALLOC_STRUCT(tq)) == NULL) {
		return (NNG_ENOMEM);
	}
	if ((tq->tq_threads = NNI_ALLOC_STRUCTS(tq->tq_threads, nthr)) ==
	    NULL) {
		NNI_FREE_STRUCT(tq);
		return (NNG_ENOMEM);
	}
	tq->tq_nthreads = nthr;
	NNI_LIST_INIT(&tq->tq_tasks, nni_task, task_node);

	nni_mtx_init(&tq->tq_mtx);
	nni_cv_init(&tq->tq_sched_cv, &tq->tq_mtx);
	nni_cv_init(&tq->tq_wait_cv, &tq->tq_mtx);

	for (int i = 0; i < nthr; i++) {
		int rv;
		tq->tq_threads[i].tqt_tq = tq;
		rv = nni_thr_init(&tq->tq_threads[i].tqt_thread,
		    nni_taskq_thread, &tq->tq_threads[i]);
		if (rv != 0) {
			nni_taskq_fini(tq);
			return (rv);
		}
	}
	tq->tq_run = true;
	for (int i = 0; i < tq->tq_nthreads; i++) {
		nni_thr_run(&tq->tq_threads[i].tqt_thread);
	}
	*tqp = tq;
	return (0);
}